

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pulseaudio.cpp
# Opt level: O0

void __thiscall anon_unknown.dwarf_23de0c::PulseCapture::stop(PulseCapture *this)

{
  pa_operation *op_00;
  PulseMainloop *in_RDI;
  pa_operation *op;
  unique_lock<std::mutex> plock;
  unique_lock<std::mutex> *plock_00;
  PulseMainloop *in_stack_ffffffffffffffd0;
  
  plock_00 = (unique_lock<std::mutex> *)((long)&(in_RDI->mMutex).super___mutex_base._M_mutex + 8);
  PulseMainloop::getUniqueLock(in_RDI);
  op_00 = (pa_operation *)
          (*(anonymous_namespace)::ppa_stream_cork)
                    (in_RDI[2].mMutex.super___mutex_base._M_mutex.__align,1,
                     PulseMainloop::streamSuccessCallbackC,plock_00);
  PulseMainloop::waitForOperation(in_stack_ffffffffffffffd0,op_00,plock_00);
  std::unique_lock<std::mutex>::~unique_lock(plock_00);
  return;
}

Assistant:

void PulseCapture::stop()
{
    auto plock = mMainloop.getUniqueLock();
    pa_operation *op{pa_stream_cork(mStream, 1, &PulseMainloop::streamSuccessCallbackC,
        &mMainloop)};
    mMainloop.waitForOperation(op, plock);
}